

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O3

void stbir__encode_uint8_linear_scaled_AR(void *outputp,int width_times_channels,float *encode)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [16];
  float *pfVar14;
  uchar *output;
  undefined8 *puVar15;
  float *pfVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  auVar13 = _DAT_005ecd50;
  puVar2 = (undefined8 *)((long)outputp + (long)width_times_channels);
  fVar17 = (float)DAT_005ecd50;
  fVar18 = DAT_005ecd50._4_4_;
  fVar19 = DAT_005ecd50._8_4_;
  fVar20 = DAT_005ecd50._12_4_;
  if (width_times_channels < 8) {
    auVar22 = _DAT_005ecd50;
    if (3 < width_times_channels) {
      do {
        auVar22._0_4_ = encode[1] * fVar18 + 0.5;
        auVar22._4_4_ = *encode * fVar17 + 0.5;
        auVar22._8_4_ = encode[3] * fVar20 + 0.5;
        auVar22._12_4_ = encode[2] * fVar19 + 0.5;
        auVar22 = minps(auVar22,auVar13);
        auVar22 = maxps(auVar22,ZEXT816(0));
        auVar25._0_4_ = (int)auVar22._0_4_;
        auVar25._4_4_ = (int)auVar22._4_4_;
        auVar25._8_4_ = (int)auVar22._8_4_;
        auVar25._12_4_ = (int)auVar22._12_4_;
        auVar22 = packssdw(auVar25,auVar25);
        sVar3 = auVar22._0_2_;
        sVar4 = auVar22._2_2_;
        sVar5 = auVar22._4_2_;
        sVar6 = auVar22._6_2_;
        *(uint *)outputp =
             CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar22[6] - (0xff < sVar6),
                      CONCAT12((0 < sVar5) * (sVar5 < 0x100) * auVar22[4] - (0xff < sVar5),
                               CONCAT11((0 < sVar4) * (sVar4 < 0x100) * auVar22[2] - (0xff < sVar4),
                                        (0 < sVar3) * (sVar3 < 0x100) * auVar22[0] - (0xff < sVar3))
                              ));
        encode = encode + 4;
        puVar1 = (undefined8 *)((long)outputp + 4);
        puVar15 = (undefined8 *)((long)outputp + 8);
        outputp = puVar1;
        auVar22 = _DAT_005ecd50;
      } while (puVar15 <= puVar2);
    }
    for (; auVar13 = _DAT_005ecd50, outputp < puVar2; outputp = (undefined8 *)((long)outputp + 2)) {
      auVar11._4_8_ = in_XMM6._8_8_;
      auVar11._0_4_ = 0x3f000000;
      auVar27._0_8_ = auVar11._0_8_ << 0x20;
      auVar27._8_4_ = 0x3f000000;
      auVar27._12_4_ = 0x3f000000;
      auVar28._4_12_ = auVar27._4_12_;
      auVar28._0_4_ = encode[1] * 255.0 + 0.5;
      auVar25 = minps(auVar28,_DAT_005ecd50);
      auVar25 = maxps(auVar25,(undefined1  [16])0x0);
      _DAT_005ecd50 = auVar22;
      *(char *)outputp = (char)(int)auVar25._0_4_;
      auVar12._4_8_ = auVar25._8_8_;
      auVar12._0_4_ = 0x3f000000;
      auVar29._0_8_ = auVar12._0_8_ << 0x20;
      auVar29._8_4_ = 0x3f000000;
      auVar29._12_4_ = 0x3f000000;
      auVar30._4_12_ = auVar29._4_12_;
      auVar30._0_4_ = *encode * 255.0 + 0.5;
      auVar22 = minps(auVar30,auVar13);
      in_XMM6 = maxps(auVar22,(undefined1  [16])0x0);
      *(char *)((long)outputp + 1) = (char)(int)in_XMM6._0_4_;
      encode = encode + 2;
      auVar22 = _DAT_005ecd50;
      _DAT_005ecd50 = auVar13;
    }
  }
  else {
    pfVar14 = encode;
    do {
      puVar1 = (undefined8 *)((long)outputp + 8);
      puVar15 = puVar2 + -1;
      if (puVar1 == puVar2) {
        puVar15 = puVar1;
      }
      pfVar16 = encode + (long)width_times_channels + -8;
      if (puVar1 == puVar2) {
        pfVar16 = pfVar14 + 8;
      }
      if (puVar1 <= puVar2 + -1) {
        pfVar16 = pfVar14 + 8;
        puVar15 = puVar1;
      }
      auVar21._0_4_ = pfVar14[1] * fVar18 + 0.5;
      auVar21._4_4_ = *pfVar14 * fVar17 + 0.5;
      auVar21._8_4_ = pfVar14[3] * fVar20 + 0.5;
      auVar21._12_4_ = pfVar14[2] * fVar19 + 0.5;
      auVar24._0_4_ = pfVar14[5] * fVar18 + 0.5;
      auVar24._4_4_ = pfVar14[4] * fVar17 + 0.5;
      auVar24._8_4_ = pfVar14[7] * fVar20 + 0.5;
      auVar24._12_4_ = pfVar14[6] * fVar19 + 0.5;
      auVar22 = minps(auVar21,auVar13);
      auVar25 = minps(auVar24,auVar13);
      auVar22 = maxps(auVar22,ZEXT816(0));
      auVar25 = maxps(auVar25,ZEXT816(0));
      auVar23._0_4_ = (int)auVar22._0_4_;
      auVar23._4_4_ = (int)auVar22._4_4_;
      auVar23._8_4_ = (int)auVar22._8_4_;
      auVar23._12_4_ = (int)auVar22._12_4_;
      auVar26._0_4_ = (int)auVar25._0_4_;
      auVar26._4_4_ = (int)auVar25._4_4_;
      auVar26._8_4_ = (int)auVar25._8_4_;
      auVar26._12_4_ = (int)auVar25._12_4_;
      auVar22 = packssdw(auVar23,auVar26);
      sVar3 = auVar22._0_2_;
      sVar4 = auVar22._2_2_;
      sVar5 = auVar22._4_2_;
      sVar6 = auVar22._6_2_;
      sVar7 = auVar22._8_2_;
      sVar8 = auVar22._10_2_;
      sVar9 = auVar22._12_2_;
      sVar10 = auVar22._14_2_;
      *(ulong *)outputp =
           CONCAT17((0 < sVar10) * (sVar10 < 0x100) * auVar22[0xe] - (0xff < sVar10),
                    CONCAT16((0 < sVar9) * (sVar9 < 0x100) * auVar22[0xc] - (0xff < sVar9),
                             CONCAT15((0 < sVar8) * (sVar8 < 0x100) * auVar22[10] - (0xff < sVar8),
                                      CONCAT14((0 < sVar7) * (sVar7 < 0x100) * auVar22[8] -
                                               (0xff < sVar7),
                                               CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar22[6] -
                                                        (0xff < sVar6),
                                                        CONCAT12((0 < sVar5) * (sVar5 < 0x100) *
                                                                 auVar22[4] - (0xff < sVar5),
                                                                 CONCAT11((0 < sVar4) *
                                                                          (sVar4 < 0x100) *
                                                                          auVar22[2] -
                                                                          (0xff < sVar4),
                                                                          (0 < sVar3) *
                                                                          (sVar3 < 0x100) *
                                                                          auVar22[0] -
                                                                          (0xff < sVar3))))))));
      pfVar14 = pfVar16;
      outputp = puVar15;
      auVar22 = _DAT_005ecd50;
    } while (puVar1 != puVar2);
  }
  _DAT_005ecd50 = auVar22;
  return;
}

Assistant:

static void STBIR__CODER_NAME( stbir__encode_uint8_linear_scaled )( void * outputp, int width_times_channels, float const * encode )
{
  unsigned char STBIR_SIMD_STREAMOUT_PTR( * ) output = (unsigned char *) outputp;
  unsigned char * end_output = ( (unsigned char *) output ) + width_times_channels;

  #ifdef STBIR_SIMD
  if ( width_times_channels >= stbir__simdfX_float_count*2 )
  {
    float const * end_encode_m8 = encode + width_times_channels - stbir__simdfX_float_count*2;
    end_output -= stbir__simdfX_float_count*2;
    STBIR_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      stbir__simdfX e0, e1;
      stbir__simdi i;
      STBIR_SIMD_NO_UNROLL(encode);
      stbir__simdfX_madd_mem( e0, STBIR_simd_point5X, STBIR_max_uint8_as_floatX, encode );
      stbir__simdfX_madd_mem( e1, STBIR_simd_point5X, STBIR_max_uint8_as_floatX, encode+stbir__simdfX_float_count );
      stbir__encode_simdfX_unflip( e0 );
      stbir__encode_simdfX_unflip( e1 );
      #ifdef STBIR_SIMD8
      stbir__simdf8_pack_to_16bytes( i, e0, e1 );
      stbir__simdi_store( output, i );
      #else
      stbir__simdf_pack_to_8bytes( i, e0, e1 );
      stbir__simdi_store2( output, i );
      #endif
      encode += stbir__simdfX_float_count*2;
      output += stbir__simdfX_float_count*2;
      if ( output <= end_output )
        continue;
      if ( output == ( end_output + stbir__simdfX_float_count*2 ) )
        break;
      output = end_output; // backup and do last couple
      encode = end_encode_m8;
    }
    return;
  }

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_NO_UNROLL_LOOP_START
  while( output <= end_output )
  {
    stbir__simdf e0;
    stbir__simdi i0;
    STBIR_NO_UNROLL(encode);
    stbir__simdf_load( e0, encode );
    stbir__simdf_madd( e0, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint8_as_float), e0 );
    stbir__encode_simdf4_unflip( e0 );
    stbir__simdf_pack_to_8bytes( i0, e0, e0 );  // only use first 4
    *(int*)(output-4) = stbir__simdi_to_int( i0 );
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    stbir__simdf e0;
    STBIR_NO_UNROLL(encode);
    stbir__simdf_madd1_mem( e0, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint8_as_float), encode+stbir__encode_order0 ); output[0] = stbir__simdf_convert_float_to_uint8( e0 );
    #if stbir__coder_min_num >= 2
    stbir__simdf_madd1_mem( e0, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint8_as_float), encode+stbir__encode_order1 ); output[1] = stbir__simdf_convert_float_to_uint8( e0 );
    #endif
    #if stbir__coder_min_num >= 3
    stbir__simdf_madd1_mem( e0, STBIR__CONSTF(STBIR_simd_point5), STBIR__CONSTF(STBIR_max_uint8_as_float), encode+stbir__encode_order2 ); output[2] = stbir__simdf_convert_float_to_uint8( e0 );
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif

  #else

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  while( output <= end_output )
  {
    float f;
    f = encode[stbir__encode_order0] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[0-4] = (unsigned char)f;
    f = encode[stbir__encode_order1] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[1-4] = (unsigned char)f;
    f = encode[stbir__encode_order2] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[2-4] = (unsigned char)f;
    f = encode[stbir__encode_order3] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[3-4] = (unsigned char)f;
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    float f;
    STBIR_NO_UNROLL(encode);
    f = encode[stbir__encode_order0] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[0] = (unsigned char)f;
    #if stbir__coder_min_num >= 2
    f = encode[stbir__encode_order1] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[1] = (unsigned char)f;
    #endif
    #if stbir__coder_min_num >= 3
    f = encode[stbir__encode_order2] * stbir__max_uint8_as_float + 0.5f; STBIR_CLAMP(f, 0, 255); output[2] = (unsigned char)f;
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif
  #endif
}